

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Man.c
# Opt level: O1

void Llb_ManStop(Llb_Man_t *p)

{
  DdManager *pDVar1;
  void **ppvVar2;
  int *piVar3;
  Vec_Ptr_t *pVVar4;
  long lVar5;
  
  if (p->pMatrix != (Llb_Mtr_t *)0x0) {
    Llb_MtrFree(p->pMatrix);
  }
  pVVar4 = p->vGroups;
  if (0 < pVVar4->nSize) {
    lVar5 = 0;
    do {
      Llb_ManGroupStop((Llb_Grp_t *)pVVar4->pArray[lVar5]);
      lVar5 = lVar5 + 1;
      pVVar4 = p->vGroups;
    } while (lVar5 < pVVar4->nSize);
  }
  if (p->dd != (DdManager *)0x0) {
    Extra_StopManager(p->dd);
  }
  pDVar1 = p->ddG;
  if (pDVar1 != (DdManager *)0x0) {
    if (pDVar1->bFunc != (DdNode *)0x0) {
      Cudd_RecursiveDeref(pDVar1,pDVar1->bFunc);
    }
    Extra_StopManager(p->ddG);
  }
  pDVar1 = p->ddR;
  if (pDVar1 != (DdManager *)0x0) {
    if (pDVar1->bFunc != (DdNode *)0x0) {
      Cudd_RecursiveDeref(pDVar1,pDVar1->bFunc);
    }
    pVVar4 = p->vRings;
    if (0 < pVVar4->nSize) {
      lVar5 = 0;
      do {
        Cudd_RecursiveDeref(p->ddR,(DdNode *)pVVar4->pArray[lVar5]);
        lVar5 = lVar5 + 1;
        pVVar4 = p->vRings;
      } while (lVar5 < pVVar4->nSize);
    }
    Extra_StopManager(p->ddR);
  }
  Aig_ManStop(p->pAig);
  if (p->vGroups != (Vec_Ptr_t *)0x0) {
    ppvVar2 = p->vGroups->pArray;
    if (ppvVar2 != (void **)0x0) {
      free(ppvVar2);
      p->vGroups->pArray = (void **)0x0;
    }
    if (p->vGroups != (Vec_Ptr_t *)0x0) {
      free(p->vGroups);
      p->vGroups = (Vec_Ptr_t *)0x0;
    }
  }
  if (p->vVar2Obj != (Vec_Int_t *)0x0) {
    piVar3 = p->vVar2Obj->pArray;
    if (piVar3 != (int *)0x0) {
      free(piVar3);
      p->vVar2Obj->pArray = (int *)0x0;
    }
    if (p->vVar2Obj != (Vec_Int_t *)0x0) {
      free(p->vVar2Obj);
      p->vVar2Obj = (Vec_Int_t *)0x0;
    }
  }
  if (p->vObj2Var != (Vec_Int_t *)0x0) {
    piVar3 = p->vObj2Var->pArray;
    if (piVar3 != (int *)0x0) {
      free(piVar3);
      p->vObj2Var->pArray = (int *)0x0;
    }
    if (p->vObj2Var != (Vec_Int_t *)0x0) {
      free(p->vObj2Var);
      p->vObj2Var = (Vec_Int_t *)0x0;
    }
  }
  if (p->vVarBegs != (Vec_Int_t *)0x0) {
    piVar3 = p->vVarBegs->pArray;
    if (piVar3 != (int *)0x0) {
      free(piVar3);
      p->vVarBegs->pArray = (int *)0x0;
    }
    if (p->vVarBegs != (Vec_Int_t *)0x0) {
      free(p->vVarBegs);
      p->vVarBegs = (Vec_Int_t *)0x0;
    }
  }
  if (p->vVarEnds != (Vec_Int_t *)0x0) {
    piVar3 = p->vVarEnds->pArray;
    if (piVar3 != (int *)0x0) {
      free(piVar3);
      p->vVarEnds->pArray = (int *)0x0;
    }
    if (p->vVarEnds != (Vec_Int_t *)0x0) {
      free(p->vVarEnds);
      p->vVarEnds = (Vec_Int_t *)0x0;
    }
  }
  if (p->vRings != (Vec_Ptr_t *)0x0) {
    ppvVar2 = p->vRings->pArray;
    if (ppvVar2 != (void **)0x0) {
      free(ppvVar2);
      p->vRings->pArray = (void **)0x0;
    }
    if (p->vRings != (Vec_Ptr_t *)0x0) {
      free(p->vRings);
      p->vRings = (Vec_Ptr_t *)0x0;
    }
  }
  if (p->vNs2Glo != (Vec_Int_t *)0x0) {
    piVar3 = p->vNs2Glo->pArray;
    if (piVar3 != (int *)0x0) {
      free(piVar3);
      p->vNs2Glo->pArray = (int *)0x0;
    }
    if (p->vNs2Glo != (Vec_Int_t *)0x0) {
      free(p->vNs2Glo);
      p->vNs2Glo = (Vec_Int_t *)0x0;
    }
  }
  if (p->vCs2Glo != (Vec_Int_t *)0x0) {
    piVar3 = p->vCs2Glo->pArray;
    if (piVar3 != (int *)0x0) {
      free(piVar3);
      p->vCs2Glo->pArray = (int *)0x0;
    }
    if (p->vCs2Glo != (Vec_Int_t *)0x0) {
      free(p->vCs2Glo);
      p->vCs2Glo = (Vec_Int_t *)0x0;
    }
  }
  if (p->vGlo2Cs != (Vec_Int_t *)0x0) {
    piVar3 = p->vGlo2Cs->pArray;
    if (piVar3 != (int *)0x0) {
      free(piVar3);
      p->vGlo2Cs->pArray = (int *)0x0;
    }
    if (p->vGlo2Cs != (Vec_Int_t *)0x0) {
      free(p->vGlo2Cs);
      p->vGlo2Cs = (Vec_Int_t *)0x0;
    }
  }
  if (p->vGlo2Ns != (Vec_Int_t *)0x0) {
    piVar3 = p->vGlo2Ns->pArray;
    if (piVar3 != (int *)0x0) {
      free(piVar3);
      p->vGlo2Ns->pArray = (int *)0x0;
    }
    if (p->vGlo2Ns != (Vec_Int_t *)0x0) {
      free(p->vGlo2Ns);
      p->vGlo2Ns = (Vec_Int_t *)0x0;
    }
  }
  if (p != (Llb_Man_t *)0x0) {
    free(p);
    return;
  }
  return;
}

Assistant:

void Llb_ManStop( Llb_Man_t * p )
{
    Llb_Grp_t * pGrp;
    DdNode * bTemp;
    int i;

//    Vec_IntFreeP( &p->vMem );
//    Vec_PtrFreeP( &p->vTops );
//    Vec_PtrFreeP( &p->vBots );
//    Vec_VecFreeP( (Vec_Vec_t **)&p->vCuts );

    if ( p->pMatrix )
        Llb_MtrFree( p->pMatrix );
    Vec_PtrForEachEntry( Llb_Grp_t *, p->vGroups, pGrp, i )
        Llb_ManGroupStop( pGrp );
    if ( p->dd )
    {
//        printf( "Manager dd\n" );
        Extra_StopManager( p->dd );
    }
    if ( p->ddG )
    {
//        printf( "Manager ddG\n" );
        if ( p->ddG->bFunc )
            Cudd_RecursiveDeref( p->ddG, p->ddG->bFunc ); 
        Extra_StopManager( p->ddG );
    }
    if ( p->ddR )
    {
//        printf( "Manager ddR\n" );
        if ( p->ddR->bFunc )
            Cudd_RecursiveDeref( p->ddR, p->ddR->bFunc ); 
        Vec_PtrForEachEntry( DdNode *, p->vRings, bTemp, i )
            Cudd_RecursiveDeref( p->ddR, bTemp );
        Extra_StopManager( p->ddR );
    }
    Aig_ManStop( p->pAig );
    Vec_PtrFreeP( &p->vGroups );
    Vec_IntFreeP( &p->vVar2Obj );
    Vec_IntFreeP( &p->vObj2Var );
    Vec_IntFreeP( &p->vVarBegs );
    Vec_IntFreeP( &p->vVarEnds );
    Vec_PtrFreeP( &p->vRings  );
    Vec_IntFreeP( &p->vNs2Glo );
    Vec_IntFreeP( &p->vCs2Glo );
    Vec_IntFreeP( &p->vGlo2Cs );
    Vec_IntFreeP( &p->vGlo2Ns );
//    Vec_IntFreeP( &p->vHints );
    ABC_FREE( p );
}